

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

bool ASN1Time_check_posix(ASN1_TIME *s,int64_t t)

{
  int iVar1;
  bool local_9d;
  int local_98;
  int local_94;
  int sec;
  int day;
  tm ttm;
  tm stm;
  int64_t t_local;
  ASN1_TIME *s_local;
  
  iVar1 = ASN1_STRING_type((ASN1_STRING *)s);
  if (iVar1 == 0x17) {
    iVar1 = asn1_utctime_to_tm((tm *)&ttm.tm_zone,s,1);
    if (iVar1 == 0) {
      return false;
    }
  }
  else {
    if (iVar1 != 0x18) {
      return false;
    }
    iVar1 = asn1_generalizedtime_to_tm((tm *)&ttm.tm_zone,s);
    if (iVar1 == 0) {
      return false;
    }
  }
  iVar1 = OPENSSL_posix_to_tm(t,(tm *)&sec);
  if ((iVar1 == 0) ||
     (iVar1 = OPENSSL_gmtime_diff(&local_94,&local_98,(tm *)&sec,(tm *)&ttm.tm_zone), iVar1 == 0)) {
    s_local._7_1_ = false;
  }
  else {
    local_9d = local_94 == 0 && local_98 == 0;
    s_local._7_1_ = local_9d;
  }
  return s_local._7_1_;
}

Assistant:

static bool ASN1Time_check_posix(const ASN1_TIME *s, int64_t t) {
  struct tm stm, ttm;
  int day, sec;

  switch (ASN1_STRING_type(s)) {
    case V_ASN1_GENERALIZEDTIME:
      if (!asn1_generalizedtime_to_tm(&stm, s)) {
        return false;
      }
      break;
    case V_ASN1_UTCTIME:
      if (!asn1_utctime_to_tm(&stm, s, /*allow_timezone_offset=*/1)) {
        return false;
      }
      break;
    default:
      return false;
  }
  if (!OPENSSL_posix_to_tm(t, &ttm) ||
      !OPENSSL_gmtime_diff(&day, &sec, &ttm, &stm)) {
    return false;
  }
  return day == 0 && sec == 0;
}